

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O2

int mbedtls_cipher_cmac_update(mbedtls_cipher_context_t *ctx,uchar *input,size_t ilen)

{
  mbedtls_cmac_context_t *pmVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong n;
  size_t local_50;
  size_t olen;
  mbedtls_cmac_context_t *local_40;
  size_t local_38;
  
  iVar3 = -0x6100;
  if (((ctx != (mbedtls_cipher_context_t *)0x0) &&
      (input != (uchar *)0x0 && ctx->cipher_info != (mbedtls_cipher_info_t *)0x0)) &&
     (pmVar1 = ctx->cmac_ctx, pmVar1 != (mbedtls_cmac_context_t *)0x0)) {
    n = (ulong)(*(uint *)&ctx->cipher_info->field_0x8 & 0x1f);
    sVar2 = pmVar1->unprocessed_len;
    olen = (size_t)ctx;
    local_40 = pmVar1;
    if ((sVar2 != 0) && (n - sVar2 < ilen)) {
      local_38 = ilen;
      memcpy(pmVar1->unprocessed_block + sVar2,input,n - sVar2);
      mbedtls_xor_no_simd(pmVar1->state,pmVar1->unprocessed_block,pmVar1->state,n);
      iVar3 = mbedtls_cipher_update
                        ((mbedtls_cipher_context_t *)olen,pmVar1->state,n,pmVar1->state,&local_50);
      if (iVar3 != 0) {
        return iVar3;
      }
      lVar4 = n - pmVar1->unprocessed_len;
      input = input + lVar4;
      ilen = local_38 - lVar4;
      pmVar1->unprocessed_len = 0;
    }
    local_38 = ((ilen + n) - 1) / n;
    lVar4 = -ilen;
    for (uVar5 = 1; pmVar1 = local_40, uVar5 < local_38; uVar5 = uVar5 + 1) {
      mbedtls_xor_no_simd(local_40->state,input,local_40->state,n);
      iVar3 = mbedtls_cipher_update
                        ((mbedtls_cipher_context_t *)olen,pmVar1->state,n,pmVar1->state,&local_50);
      if (iVar3 != 0) {
        return iVar3;
      }
      input = input + n;
      lVar4 = lVar4 + n;
    }
    iVar3 = 0;
    if (lVar4 != 0) {
      memcpy(local_40->unprocessed_block + local_40->unprocessed_len,input,-lVar4);
      pmVar1->unprocessed_len = pmVar1->unprocessed_len - lVar4;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_cipher_cmac_update(mbedtls_cipher_context_t *ctx,
                               const unsigned char *input, size_t ilen)
{
    mbedtls_cmac_context_t *cmac_ctx;
    unsigned char *state;
    int ret = 0;
    size_t n, j, olen, block_size;

    if (ctx == NULL || ctx->cipher_info == NULL || input == NULL ||
        ctx->cmac_ctx == NULL) {
        return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

    cmac_ctx = ctx->cmac_ctx;
    block_size = mbedtls_cipher_info_get_block_size(ctx->cipher_info);
    state = ctx->cmac_ctx->state;

    /* Is there data still to process from the last call, that's greater in
     * size than a block? */
    if (cmac_ctx->unprocessed_len > 0 &&
        ilen > block_size - cmac_ctx->unprocessed_len) {
        memcpy(&cmac_ctx->unprocessed_block[cmac_ctx->unprocessed_len],
               input,
               block_size - cmac_ctx->unprocessed_len);

        mbedtls_xor_no_simd(state, cmac_ctx->unprocessed_block, state, block_size);

        if ((ret = mbedtls_cipher_update(ctx, state, block_size, state,
                                         &olen)) != 0) {
            goto exit;
        }

        input += block_size - cmac_ctx->unprocessed_len;
        ilen -= block_size - cmac_ctx->unprocessed_len;
        cmac_ctx->unprocessed_len = 0;
    }

    /* n is the number of blocks including any final partial block */
    n = (ilen + block_size - 1) / block_size;

    /* Iterate across the input data in block sized chunks, excluding any
     * final partial or complete block */
    for (j = 1; j < n; j++) {
        mbedtls_xor_no_simd(state, input, state, block_size);

        if ((ret = mbedtls_cipher_update(ctx, state, block_size, state,
                                         &olen)) != 0) {
            goto exit;
        }

        ilen -= block_size;
        input += block_size;
    }

    /* If there is data left over that wasn't aligned to a block */
    if (ilen > 0) {
        memcpy(&cmac_ctx->unprocessed_block[cmac_ctx->unprocessed_len],
               input,
               ilen);
        cmac_ctx->unprocessed_len += ilen;
    }

exit:
    return ret;
}